

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<char[9],std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,char (*expected) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  char (*actual_expression) [9];
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  internal *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  char (*expected_local) [9];
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = (internal *)expected;
  actual_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_str;
  expected_local = (char (*) [9])expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<std::__cxx11::string,char[9]>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected,
                     (char (*) [9])actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<char[9],std::__cxx11::string>
              (&local_50,(internal *)actual_local,(char (*) [9])local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_str);
    FormatForComparisonFailureMessage<std::__cxx11::string,char[9]>
              (&local_70,local_30,actual_local,(char (*) [9])actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,*actual_expression,&local_50,&local_70,
              false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }